

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyBindSparseResourceMemoryAttribs
               (IRenderDevice *pDevice,BindSparseResourceMemoryAttribs *Attribs)

{
  Uint32 *pUVar1;
  Uint32 *pUVar2;
  Uint32 *Args_5;
  Uint32 *Args_5_00;
  Uint64 *Args_8;
  SparseBufferMemoryBindRange *Args_5_01;
  SparseBufferMemoryBindRange *pSVar3;
  SparseTextureMemoryBindRange *Args_5_02;
  RESOURCE_DIMENSION RVar4;
  IDeviceMemory *pIVar5;
  SparseTextureMemoryBindRange *pSVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  type_conflict1 tVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar14;
  ulong uVar15;
  TextureDesc *TexDesc;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  uint uVar16;
  Uint32 UVar17;
  BindSparseResourceMemoryAttribs *Args_1;
  undefined4 extraout_EDX;
  Uint32 UVar18;
  Uint64 *pUVar19;
  IFence *pIVar20;
  char (*in_R9) [45];
  char (*Args_9) [32];
  SparseTextureMemoryBindInfo *pSVar21;
  SparseBufferMemoryBindInfo *pSVar22;
  Box *this;
  uint3 uVar23;
  char (*Args_9_00) [86];
  char (*pacVar24) [42];
  char (*pacVar25) [2];
  char (*Args_5_03) [69];
  char (*Args_5_04) [23];
  char (*Args_5_05) [59];
  char (*Args_9_01) [84];
  char (*Args_5_06) [43];
  char (*in_stack_fffffffffffffed8) [10];
  uint local_120;
  uint local_11c;
  string msg_21;
  Uint64 Capacity;
  BindSparseResourceMemoryAttribs *local_f0;
  string msg;
  Uint32 MipDepth;
  Uint32 MipHeight;
  Uint32 MipWidth;
  char (*local_a0) [41];
  char (*local_98) [41];
  char (*local_90) [42];
  char (*local_88) [49];
  int local_7c;
  char (*local_78) [39];
  Uint32 *local_70;
  char (*local_68) [42];
  SparseTextureMemoryBindInfo *local_60;
  Box *local_58;
  long local_50;
  Uint32 *local_48;
  Uint32 *local_40;
  Uint32 *local_38;
  undefined4 extraout_var_03;
  
  iVar9 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
  pUVar1 = &Attribs->NumBufferBinds;
  local_f0 = Attribs;
  if (Attribs->NumBufferBinds != 0) {
    if (Attribs->pBufferBinds == (SparseBufferMemoryBindInfo *)0x0) {
      FormatString<char[41],char[19],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumBufferBinds is ",(char (*) [19])pUVar1,
                 (uint *)", but pBufferBinds is null",(char (*) [27])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x471);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar9) + 0x1b0) & 2) == 0) {
      FormatString<char[41],char[91]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported"
                 ,(char (*) [91])local_f0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x472);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  local_70 = &local_f0->NumTextureBinds;
  if (local_f0->NumTextureBinds != 0) {
    Args_1 = local_f0;
    if (local_f0->pTextureBinds == (SparseTextureMemoryBindInfo *)0x0) {
      FormatString<char[41],char[20],unsigned_int,char[28]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"NumTextureBinds is ",(char (*) [20])local_70,
                 (uint *)", but pTextureBinds is null",(char (*) [28])in_R9);
      Args_1 = (BindSparseResourceMemoryAttribs *)0x476;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x476);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((*(byte *)(CONCAT44(extraout_var,iVar9) + 0x1b0) & 4) == 0) {
      FormatString<char[41],char[96]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])
                 "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported"
                 ,(char (*) [96])Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x477);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  if (*local_70 == 0 && *pUVar1 == 0) {
    FormatString<char[41],char[59]>
              (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
               (char (*) [41])"One of NumBufferBinds and NumTextureBinds must not be zero",
               (char (*) [59])pUVar1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x47a);
    std::__cxx11::string::~string((string *)&msg);
  }
  iVar9 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  local_7c = *(int *)CONCAT44(extraout_var_00,iVar9);
  uVar10 = 0;
  while (uVar10 < *pUVar1) {
    pSVar22 = local_f0->pBufferBinds;
    local_120 = uVar10;
    if (pSVar22[uVar10].pBuffer == (IBuffer *)0x0) {
      FormatString<char[41],char[14],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                 (uint *)"].pBuffer must not be null",(char (*) [27])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x482);
      std::__cxx11::string::~string((string *)&msg);
    }
    pSVar22 = pSVar22 + uVar10;
    if (pSVar22->NumRanges == 0) {
      FormatString<char[41],char[14],unsigned_int,char[29]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                 (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x483);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (pSVar22->pRanges == (SparseBufferMemoryBindRange *)0x0) {
      FormatString<char[41],char[14],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                 (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x484);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (pSVar22->pBuffer != (IBuffer *)0x0) {
      iVar9 = (*(pSVar22->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      if (*(char *)(CONCAT44(extraout_var_01,iVar9) + 0x14) != '\x05') {
        FormatString<char[41],char[14],unsigned_int,char[44]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                   (uint *)"].pBuffer must be created with USAGE_SPARSE",(char (*) [44])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x48a);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (pSVar22->pRanges != (SparseBufferMemoryBindRange *)0x0) {
        Args_9_00 = (char (*) [86])0x203c97;
        iVar11 = (*(pSVar22->pBuffer->super_IDeviceObject).super_IObject._vptr_IObject[0x10])();
        msg_21._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar11);
        msg_21._M_string_length = CONCAT44(msg_21._M_string_length._4_4_,extraout_EDX);
        Args_9 = (char (*) [32])(CONCAT44(extraout_var_01,iVar9) + 8);
        for (local_11c = 0; local_11c < pSVar22->NumRanges; local_11c = local_11c + 1) {
          Args_5_01 = pSVar22->pRanges + local_11c;
          pSVar3 = pSVar22->pRanges + local_11c;
          pUVar19 = &pSVar3->MemorySize;
          uVar15 = pSVar3->BufferOffset;
          if (*(ulong *)*Args_9 < *pUVar19 + uVar15) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[32],unsigned_long,char[2]>
                      (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,(uint *)"].pRanges["
                       ,(char (*) [11])in_R9,(uint *)"] specifies a range with offset ",
                       (char (*) [33])Args_5_01,(unsigned_long *)" and size ",(char (*) [11])pUVar19
                       ,(unsigned_long *)" that exceeds the buffer size (",Args_9,
                       (unsigned_long *)0x2caa26,(char (*) [2])Args_9_00);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x495);
            Args_9_00 = (char (*) [86])0x203d4f;
            std::__cxx11::string::~string((string *)&msg);
            uVar15 = Args_5_01->BufferOffset;
          }
          if (uVar15 % (msg_21._M_string_length & 0xffffffff) != 0) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[17],unsigned_long,char[48],unsigned_int,char[2]>
                      (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,(uint *)"].pRanges["
                       ,(char (*) [11])in_R9,(uint *)"].BufferOffset (",(char (*) [17])Args_5_01,
                       (unsigned_long *)") must be a multiple of the buffer block size (",
                       (char (*) [48])&msg_21._M_string_length,(uint *)0x2caa26,
                       (char (*) [2])Args_9_00);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x498);
            Args_9_00 = (char (*) [86])0x203dd1;
            std::__cxx11::string::~string((string *)&msg);
          }
          uVar15 = *pUVar19;
          if (uVar15 == 0) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,(uint *)"].pRanges["
                       ,(char (*) [11])in_R9,(uint *)"].MemorySize must not be zero",
                       (char (*) [30])Args_9_00);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x49b);
            Args_9_00 = (char (*) [86])0x203e32;
            std::__cxx11::string::~string((string *)&msg);
            uVar15 = *pUVar19;
          }
          if (uVar15 % (msg_21._M_string_length & 0xffffffff) != 0) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[59],unsigned_int,char[2]>
                      (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,(uint *)"].pRanges["
                       ,(char (*) [11])in_R9,
                       (uint *)"].MemorySize must be a multiple of the buffer block size (",
                       (char (*) [59])&msg_21._M_string_length,(uint *)0x2caa26,
                       (char (*) [2])Args_9_00);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x49d);
            Args_9_00 = (char (*) [86])0x203eaa;
            std::__cxx11::string::~string((string *)&msg);
          }
          pIVar5 = Args_5_01->pMemory;
          if (pIVar5 == (IDeviceMemory *)0x0) {
            if (Args_5_01->MemoryOffset != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[52]>
                        (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"]: if pMemory is null, but MemoryOffset is not zero",
                         (char (*) [52])Args_9_00);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4b4);
              Args_9_00 = (char (*) [86])0x2040b7;
              std::__cxx11::string::~string((string *)&msg);
            }
          }
          else {
            pacVar24 = (char (*) [42])0x203ec1;
            cVar7 = (**(code **)(*(long *)pIVar5 + 0x50))(pIVar5,pSVar22->pBuffer);
            if (cVar7 == '\0') {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[42]>
                        (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"].pMemory must be compatible with pBuffer",pacVar24);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4a2);
              std::__cxx11::string::~string((string *)&msg);
            }
            pacVar25 = (char (*) [2])0x203f28;
            Capacity = (**(code **)(*(long *)Args_5_01->pMemory + 0x48))();
            if (Capacity < Args_5_01->MemorySize + Args_5_01->MemoryOffset) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[39],unsigned_long,char[2]>
                        (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"] specifies a range with offset ",
                         (char (*) [33])&Args_5_01->MemoryOffset,(unsigned_long *)" and size ",
                         (char (*) [11])pUVar19,
                         (unsigned_long *)" that exceeds the device memory size (",
                         (char (*) [39])&Capacity,(unsigned_long *)0x2caa26,pacVar25);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4a7);
              std::__cxx11::string::~string((string *)&msg);
            }
            Args_9_00 = (char (*) [86])0x203fc8;
            lVar14 = (**(code **)(*(long *)Args_5_01->pMemory + 0x20))();
            if (*(ulong *)(lVar14 + 0x10) <
                Args_5_01->MemoryOffset % *(ulong *)(lVar14 + 0x10) + Args_5_01->MemorySize) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[14],unsigned_int,char[11],unsigned_int,char[33],unsigned_long,char[11],unsigned_long,char[86]>
                        (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pBufferBinds[",(char (*) [14])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"] specifies a range with offset ",
                         (char (*) [33])&Args_5_01->MemoryOffset,(unsigned_long *)" and size ",
                         (char (*) [11])pUVar19,
                         (unsigned_long *)
                         " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error"
                         ,Args_9_00);
              DebugAssertionFailed
                        (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4af);
              Args_9_00 = (char (*) [86])0x20404e;
              std::__cxx11::string::~string((string *)&msg);
            }
          }
        }
      }
    }
    uVar10 = local_120 + 1;
  }
  uVar15 = 0;
  while( true ) {
    local_120 = (uint)uVar15;
    if (*local_70 <= local_120) break;
    pSVar21 = local_f0->pTextureBinds;
    if (pSVar21[uVar15].pTexture == (ITexture *)0x0) {
      FormatString<char[41],char[15],unsigned_int,char[28]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                 (uint *)"].pTexture must not be null",(char (*) [28])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4bc);
      std::__cxx11::string::~string((string *)&msg);
    }
    pSVar21 = pSVar21 + uVar15;
    if (pSVar21->NumRanges == 0) {
      FormatString<char[41],char[15],unsigned_int,char[29]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                 (uint *)"].NumRanges must not be zero",(char (*) [29])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4bd);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (pSVar21->pRanges == (SparseTextureMemoryBindRange *)0x0) {
      FormatString<char[41],char[15],unsigned_int,char[27]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                 (uint *)"].pRanges must not be null",(char (*) [27])in_R9);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x4be);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (pSVar21->pTexture != (ITexture *)0x0) {
      iVar9 = (*(pSVar21->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      TexDesc = (TextureDesc *)CONCAT44(extraout_var_03,iVar9);
      if (TexDesc->Usage != USAGE_SPARSE) {
        FormatString<char[41],char[15],unsigned_int,char[45]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                   (uint *)"].pTexture must be created with USAGE_SPARSE",in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x4c4);
        std::__cxx11::string::~string((string *)&msg);
      }
      if (pSVar21->pRanges != (SparseTextureMemoryBindRange *)0x0) {
        iVar9 = (*(pSVar21->pTexture->super_IDeviceObject).super_IObject._vptr_IObject[0xd])();
        local_50 = CONCAT44(extraout_var_04,iVar9);
        local_48 = &TexDesc->MipLevels;
        local_68 = (char (*) [42])(local_50 + 0x20);
        local_78 = (char (*) [39])(local_50 + 0x18);
        local_88 = (char (*) [49])(local_50 + 0x30);
        local_a0 = (char (*) [41])(local_50 + 0x24);
        local_90 = (char (*) [42])(local_50 + 0x28);
        local_98 = (char (*) [41])(local_50 + 0x2c);
        uVar10 = 0;
        local_60 = pSVar21;
        while( true ) {
          local_11c = uVar10;
          if (local_60->NumRanges <= uVar10) break;
          pSVar6 = local_60->pRanges;
          Args_5_02 = pSVar6 + uVar10;
          Args_5_03 = (char (*) [69])0x2042f8;
          GetMipLevelProperties((MipLevelProperties *)&msg,TexDesc,pSVar6[uVar10].MipLevel);
          pacVar24 = local_68;
          MipWidth = (Uint32)msg._M_string_length;
          MipHeight = msg._M_string_length._4_4_;
          MipDepth = msg.field_2._M_allocated_capacity._0_4_;
          uVar12 = pSVar6[uVar10].MipLevel;
          if (TexDesc->MipLevels <= uVar12) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[3]>
                      (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                       (char (*) [13])Args_5_02,(uint *)") must be less than the mip level count (",
                       (char (*) [42])local_48,(uint *)0x2ed6c5,(char (*) [3])Args_5_03);
            DebugAssertionFailed
                      (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x4d5);
            Args_5_03 = (char (*) [69])0x20439e;
            std::__cxx11::string::~string((string *)&msg_21);
            uVar12 = Args_5_02->MipLevel;
          }
          uVar16 = *(uint *)*pacVar24;
          if (uVar16 < uVar12) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[13],unsigned_int,char[42],unsigned_int,char[2]>
                      (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MipLevel (",
                       (char (*) [13])Args_5_02,(uint *)") must not exceed the first mip in tail (",
                       pacVar24,(uint *)0x2caa26,(char (*) [2])Args_5_03);
            DebugAssertionFailed
                      (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x4d8);
            Args_5_03 = (char (*) [69])0x20441a;
            std::__cxx11::string::~string((string *)&msg_21);
            uVar12 = Args_5_02->MipLevel;
            uVar16 = *(uint *)*pacVar24;
          }
          this = &pSVar6[uVar10].Region;
          if (uVar12 < uVar16) {
            if (Args_5_02->OffsetInMipTail != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[69]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)
                         "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip",
                         Args_5_03);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4dd);
              std::__cxx11::string::~string((string *)&msg_21);
            }
            Args_5_04 = (char (*) [23])0x20449d;
            bVar8 = Box::IsValid(this);
            if (!bVar8) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[23]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region must be valid",
                         Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4df);
              Args_5_04 = (char (*) [23])0x2044fd;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            pUVar1 = &(Args_5_02->Region).MaxX;
            uVar10 = (Args_5_02->Region).MaxX;
            if (MipWidth < uVar10) {
              Args_5_04 = (char (*) [23])0x204523;
              tVar13 = AlignUp<unsigned_int,unsigned_int>(MipWidth,*(uint *)*local_a0);
              if (uVar10 != tVar13) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxX (",
                           (char (*) [16])pUVar1,(uint *)") must not exceed the mip level width (",
                           (char (*) [40])&MipWidth,(uint *)0x2caa26,(char (*) [2])Args_5_04);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4e1);
                Args_5_04 = (char (*) [23])0x20459e;
                std::__cxx11::string::~string((string *)&msg_21);
              }
            }
            pUVar2 = &(Args_5_02->Region).MaxY;
            uVar10 = (Args_5_02->Region).MaxY;
            if (MipHeight < uVar10) {
              Args_5_04 = (char (*) [23])0x2045c4;
              tVar13 = AlignUp<unsigned_int,unsigned_int>(MipHeight,*(uint *)*local_90);
              if (uVar10 != tVar13) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxY (",
                           (char (*) [16])pUVar2,(uint *)") must not exceed the mip level height (",
                           (char (*) [41])&MipHeight,(uint *)0x2caa26,(char (*) [2])Args_5_04);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4e3);
                Args_5_04 = (char (*) [23])0x20463f;
                std::__cxx11::string::~string((string *)&msg_21);
              }
            }
            Args_5 = &(Args_5_02->Region).MaxZ;
            uVar10 = (Args_5_02->Region).MaxZ;
            local_38 = pUVar2;
            if (MipDepth < uVar10) {
              Args_5_04 = (char (*) [23])0x20466a;
              tVar13 = AlignUp<unsigned_int,unsigned_int>(MipDepth,*(uint *)*local_98);
              if (uVar10 != tVar13) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[40],unsigned_int,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MaxZ (",
                           (char (*) [16])Args_5,(uint *)") must not exceed the mip level depth (",
                           (char (*) [40])&MipDepth,(uint *)0x2caa26,(char (*) [2])Args_5_04);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x4e5);
                Args_5_04 = (char (*) [23])0x2046e5;
                std::__cxx11::string::~string((string *)&msg_21);
              }
            }
            if (this->MinX % *(uint *)*local_a0 != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinX (",
                         (char (*) [16])this,(uint *)") must be a multiple of the tile width (",
                         local_a0,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4e8);
              Args_5_04 = (char (*) [23])0x20476d;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            pUVar2 = &(Args_5_02->Region).MinY;
            if ((Args_5_02->Region).MinY % *(uint *)*local_90 != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[42],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinY (",
                         (char (*) [16])pUVar2,(uint *)") must be a multiple of the tile height (",
                         local_90,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ea);
              Args_5_04 = (char (*) [23])0x2047f9;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            Args_5_00 = &(Args_5_02->Region).MinZ;
            local_58 = this;
            local_40 = Args_5;
            if ((Args_5_02->Region).MinZ % *(uint *)*local_98 != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[16],unsigned_int,char[41],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region.MinZ (",
                         (char (*) [16])Args_5_00,(uint *)") must be a multiple of the tile depth ("
                         ,local_98,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ec);
              Args_5_04 = (char (*) [23])0x2048a8;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            UVar18 = *pUVar1;
            uVar10 = UVar18 - local_58->MinX;
            if ((uVar10 % *(uint *)*local_a0 != 0) && (UVar18 != MipWidth)) {
              Capacity = CONCAT44(Capacity._4_4_,uVar10);
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region width (",
                         (char (*) [17])&Capacity,(uint *)") must be a multiple of the tile width ("
                         ,local_a0,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4ee);
              Args_5_04 = (char (*) [23])0x204962;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            uVar10 = *local_38 - *pUVar2;
            if ((uVar10 % *(uint *)*local_90 != 0) && (*local_38 != MipHeight)) {
              Capacity = CONCAT44(Capacity._4_4_,uVar10);
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[18],unsigned_int,char[40],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region height (",
                         (char (*) [18])&Capacity,(uint *)") must be multiple of the tile height (",
                         (char (*) [40])local_90,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f0);
              Args_5_04 = (char (*) [23])0x204a15;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            this = local_58;
            uVar10 = *local_40 - *Args_5_00;
            if ((uVar10 % *(uint *)*local_98 != 0) && (*local_40 != MipDepth)) {
              Capacity = CONCAT44(Capacity._4_4_,uVar10);
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[17],unsigned_int,char[41],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].Region depth (",
                         (char (*) [17])&Capacity,(uint *)") must be a multiple of the tile depth ("
                         ,local_98,(uint *)0x2caa26,(char (*) [2])Args_5_04);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f2);
LAB_00204da4:
              std::__cxx11::string::~string((string *)&msg_21);
            }
          }
          else {
            msg_21._M_dataplus._M_p = (pointer)0x0;
            msg_21._M_string_length = 0;
            msg_21.field_2._M_allocated_capacity = 0x100000000;
            Args_5_05 = (char (*) [59])0x204aed;
            bVar8 = Box::operator==(this,(Box *)&msg_21);
            if (!bVar8) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[59]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"].Region must be default when Range.MipLevel is a tail mip",
                         Args_5_05);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4f7);
              Args_5_05 = (char (*) [59])0x204b4d;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            pUVar19 = &Args_5_02->OffsetInMipTail;
            uVar15 = Args_5_02->OffsetInMipTail;
            Args_8 = &Args_5_02->MemorySize;
            if (*(ulong *)*local_78 < Args_5_02->MemorySize + uVar15) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30],unsigned_long,char[19],unsigned_long,char[34],unsigned_long,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"] specifies OffsetInMipTail (",(char (*) [30])pUVar19,
                         (unsigned_long *)") and MemorySize (",(char (*) [19])Args_8,
                         (unsigned_long *)") that exceed the mip tail size (",
                         (char (*) [34])local_78,(unsigned_long *)0x2caa26,(char (*) [2])Args_5_05);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4fa);
              Args_5_05 = (char (*) [59])0x204bef;
              std::__cxx11::string::~string((string *)&msg_21);
              uVar15 = *pUVar19;
            }
            if (uVar15 % (ulong)*(uint *)*local_88 != 0) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[20],unsigned_long,char[49],unsigned_int,char[2]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].OffsetInMipTail (",
                         (char (*) [20])pUVar19,
                         (unsigned_long *)") must be a multiple of the texture block size (",
                         local_88,(uint *)0x2caa26,(char (*) [2])Args_5_05);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x4fd);
              Args_5_05 = (char (*) [59])0x204c7a;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            if (((*(byte *)(local_50 + 0x34) & 1) != 0) && (Args_5_02->ArraySlice != 0)) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[34]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                         (char (*) [15])&Args_5_02->ArraySlice,
                         (uint *)") must be 0 for a single mip tail",(char (*) [34])Args_5_05);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x502);
              std::__cxx11::string::~string((string *)&msg_21);
            }
            if ((local_7c == 6) &&
               ((*pUVar19 != 0 || ((*Args_8 != 0 && (*Args_8 != *(Uint64 *)*local_78)))))) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[63],char[18],unsigned_long,char[32],unsigned_long,char[39],unsigned_long,char[10]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"]: in Metal, mip tail must be bound in a single memory range: ",
                         (char (*) [63])0x2e59ae,(char (*) [18])pUVar19,
                         (unsigned_long *)") must be zero and MemorySize (",(char (*) [32])Args_8,
                         (unsigned_long *)") must be equal to the mip tail size (",local_78,
                         (unsigned_long *)") or zero",in_stack_fffffffffffffed8);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x50a);
              goto LAB_00204da4;
            }
          }
          RVar4 = TexDesc->Type;
          Args_9_01 = (char (*) [84])0x1;
          UVar17 = 1;
          UVar18 = UVar17;
          if ((RVar4 < 9) && (UVar18 = 1, (0x1a8U >> (RVar4 & 0x1f) & 1) != 0)) {
            UVar18 = (TexDesc->field_3).ArraySize;
          }
          if (UVar18 <= Args_5_02->ArraySlice) {
            if ((RVar4 < 9) && ((0x1a8U >> (RVar4 & 0x1f) & 1) != 0)) {
              UVar17 = (TexDesc->field_3).ArraySize;
            }
            Capacity = CONCAT44(Capacity._4_4_,UVar17);
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_int,char[37],unsigned_int,char[2]>
                      (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].ArraySlice (",
                       (char (*) [15])&Args_5_02->ArraySlice,
                       (uint *)") must be less than the array size (",(char (*) [37])&Capacity,
                       (uint *)0x2caa26,(char (*) [2])0x1);
            DebugAssertionFailed
                      (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x50f);
            Args_9_01 = (char (*) [84])0x204e78;
            std::__cxx11::string::~string((string *)&msg_21);
          }
          pUVar19 = &Args_5_02->MemorySize;
          if (Args_5_02->MemorySize % (ulong)*(uint *)*local_88 != 0) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[49],unsigned_int,char[2]>
                      (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                       (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                       (char (*) [15])pUVar19,
                       (unsigned_long *)") must be a multiple of the texture block size (",local_88,
                       (uint *)0x2caa26,(char (*) [2])Args_9_01);
            DebugAssertionFailed
                      (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x514);
            Args_9_01 = (char (*) [84])0x204f09;
            std::__cxx11::string::~string((string *)&msg_21);
          }
          if (local_7c != 6) {
            uVar10 = Args_5_02->MipLevel;
            uVar12 = *(uint *)*local_68;
            if ((Args_5_02->MemorySize != 0) && (uVar10 < uVar12)) {
              Args_9_01 = (char (*) [84])0x204f48;
              uVar23 = GetNumSparseTilesInBox(this,(Uint32 *)local_a0);
              pacVar24 = local_68;
              uVar10 = uVar23.field_0._0_4_ * uVar23.field_0._8_4_ * uVar23.field_0._4_4_;
              Capacity = CONCAT44(Capacity._4_4_,uVar10);
              if ((ulong)*(uint *)*local_88 * (ulong)uVar10 - *pUVar19 != 0) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[15],unsigned_long,char[50],unsigned_int,char[26]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,(uint *)"].MemorySize (",
                           (char (*) [15])pUVar19,
                           (unsigned_long *)") does not match the sparse memory blocks count (",
                           (char (*) [50])&Capacity,(uint *)") in the specified region",
                           (char (*) [26])Args_9_01);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x51f);
                Args_9_01 = (char (*) [84])0x204fe8;
                std::__cxx11::string::~string((string *)&msg_21);
              }
              uVar10 = Args_5_02->MipLevel;
              uVar12 = *(uint *)*pacVar24;
            }
            if ((uVar10 == uVar12) && (*pUVar19 == 0)) {
              in_R9 = (char (*) [45])&local_11c;
              FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[30]>
                        (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                         (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                         (uint *)"].pRanges[",(char (*) [11])in_R9,
                         (uint *)"].MemorySize must not be zero",(char (*) [30])Args_9_01);
              DebugAssertionFailed
                        (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                         ,0x527);
              Args_9_01 = (char (*) [84])0x205054;
              std::__cxx11::string::~string((string *)&msg_21);
            }
            pIVar5 = Args_5_02->pMemory;
            if (pIVar5 != (IDeviceMemory *)0x0) {
              Args_5_06 = (char (*) [43])0x205072;
              cVar7 = (**(code **)(*(long *)pIVar5 + 0x50))(pIVar5,local_60->pTexture);
              if (cVar7 == '\0') {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[43]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"].pMemory must be compatible with pTexture",Args_5_06);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x52d);
                std::__cxx11::string::~string((string *)&msg_21);
              }
              pacVar25 = (char (*) [2])0x2050dc;
              Capacity = (**(code **)(*(long *)Args_5_02->pMemory + 0x48))();
              if (Capacity < Args_5_02->MemorySize + Args_5_02->MemoryOffset) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[36],unsigned_long,char[2]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies MemoryOffset (",
                           (char (*) [27])&Args_5_02->MemoryOffset,
                           (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar19,
                           (unsigned_long *)") that exceed the memory capacity (",
                           (char (*) [36])&Capacity,(unsigned_long *)0x2caa26,pacVar25);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x532);
                std::__cxx11::string::~string((string *)&msg_21);
              }
              Args_9_01 = (char (*) [84])0x205179;
              lVar14 = (**(code **)(*(long *)Args_5_02->pMemory + 0x20))();
              if (*(ulong *)(lVar14 + 0x10) <
                  Args_5_02->MemoryOffset % *(ulong *)(lVar14 + 0x10) + Args_5_02->MemorySize) {
                in_R9 = (char (*) [45])&local_11c;
                FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[27],unsigned_long,char[19],unsigned_long,char[84]>
                          (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                           (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                           (uint *)"].pRanges[",(char (*) [11])in_R9,
                           (uint *)"] specifies MemoryOffset (",
                           (char (*) [27])&Args_5_02->MemoryOffset,
                           (unsigned_long *)") and MemorySize (",(char (*) [19])pUVar19,
                           (unsigned_long *)
                           ") that don\'t fit into a single page. In Direct3D12 and Vulkan this will be an error"
                           ,Args_9_01);
                DebugAssertionFailed
                          (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                           ,0x539);
                Args_9_01 = (char (*) [84])0x2051fe;
                std::__cxx11::string::~string((string *)&msg_21);
              }
            }
          }
          if ((Args_5_02->pMemory == (IDeviceMemory *)0x0) && (Args_5_02->MemoryOffset != 0)) {
            in_R9 = (char (*) [45])&local_11c;
            FormatString<char[41],char[15],unsigned_int,char[11],unsigned_int,char[49]>
                      (&msg_21,(Diligent *)"Bind sparse memory attribs are invalid: ",
                       (char (*) [41])"pTextureBinds[",(char (*) [15])&local_120,
                       (uint *)"].pRanges[",(char (*) [11])in_R9,
                       (uint *)"]: pMemory is null, but MemoryOffset is not zero",
                       (char (*) [49])Args_9_01);
            DebugAssertionFailed
                      (msg_21._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x540);
            std::__cxx11::string::~string((string *)&msg_21);
          }
          uVar10 = local_11c + 1;
        }
      }
    }
    uVar15 = (ulong)(local_120 + 1);
  }
  if (local_f0->NumWaitFences != 0) {
    if (local_f0->ppWaitFences == (IFence **)0x0) {
      FormatString<char[41],char[59]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppWaitFences must not be null if NumWaitFences is not zero",
                 (char (*) [59])local_f0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x548);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (local_f0->pWaitFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pWaitFenceValues must not be null if NumWaitFences is not zero",
                 (char (*) [63])local_f0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x549);
      std::__cxx11::string::~string((string *)&msg);
      if (local_f0->pWaitFenceValues == (Uint64 *)0x0) goto LAB_00205418;
    }
    uVar15 = 0;
    while( true ) {
      msg_21._M_dataplus._M_p._0_4_ = (uint)uVar15;
      if (local_f0->NumWaitFences <= (uint)uVar15) break;
      pIVar20 = local_f0->ppWaitFences[uVar15];
      if (pIVar20 == (IFence *)0x0) {
        FormatString<char[41],char[14],unsigned_int,char[19]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                   (uint *)"] must not be null",(char (*) [19])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x54f);
        std::__cxx11::string::~string((string *)&msg);
        pIVar20 = local_f0->ppWaitFences[(ulong)msg_21._M_dataplus._M_p & 0xffffffff];
      }
      iVar9 = (*(pIVar20->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      if (*(char *)(CONCAT44(extraout_var_05,iVar9) + 8) != '\x01') {
        FormatString<char[41],char[14],unsigned_int,char[23]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"ppWaitFences[",(char (*) [14])&msg_21,
                   (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x550);
        std::__cxx11::string::~string((string *)&msg);
      }
      uVar15 = (ulong)((uint)msg_21._M_dataplus._M_p + 1);
    }
  }
LAB_00205418:
  if (local_f0->NumSignalFences != 0) {
    if (local_f0->ppSignalFences == (IFence **)0x0) {
      FormatString<char[41],char[63]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"ppSignalFences must not be null if NumSignalFences is not zero",
                 (char (*) [63])local_f0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x557);
      std::__cxx11::string::~string((string *)&msg);
    }
    if (local_f0->pSignalFenceValues == (Uint64 *)0x0) {
      FormatString<char[41],char[67]>
                (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                 (char (*) [41])"pSignalFenceValues must not be null if NumSignalFences is not zero"
                 ,(char (*) [67])local_f0);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x558);
      std::__cxx11::string::~string((string *)&msg);
      if (local_f0->pSignalFenceValues == (Uint64 *)0x0) {
        return true;
      }
    }
    uVar10 = 0;
    while( true ) {
      msg_21._M_dataplus._M_p._0_4_ = uVar10;
      if (local_f0->NumSignalFences <= uVar10) break;
      pIVar20 = local_f0->ppSignalFences[uVar10];
      if (pIVar20 == (IFence *)0x0) {
        FormatString<char[41],char[16],unsigned_int,char[19]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                   (uint *)"] must not be null",(char (*) [19])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x55e);
        std::__cxx11::string::~string((string *)&msg);
        pIVar20 = local_f0->ppSignalFences[(ulong)msg_21._M_dataplus._M_p & 0xffffffff];
      }
      iVar9 = (*(pIVar20->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      if (*(char *)(CONCAT44(extraout_var_06,iVar9) + 8) != '\x01') {
        FormatString<char[41],char[16],unsigned_int,char[23]>
                  (&msg,(Diligent *)"Bind sparse memory attribs are invalid: ",
                   (char (*) [41])"ppSignalFences[",(char (*) [16])&msg_21,
                   (uint *)"] must be GENERAL type",(char (*) [23])in_R9);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyBindSparseResourceMemoryAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x55f);
        std::__cxx11::string::~string((string *)&msg);
      }
      uVar10 = (uint)msg_21._M_dataplus._M_p + 1;
    }
  }
  return true;
}

Assistant:

bool VerifyBindSparseResourceMemoryAttribs(const IRenderDevice* pDevice, const BindSparseResourceMemoryAttribs& Attribs)
{
#define CHECK_BIND_SPARSE_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Bind sparse memory attribs are invalid: ", __VA_ARGS__)

    const SparseResourceProperties& SparseRes = pDevice->GetAdapterInfo().SparseResources;

    if (Attribs.NumBufferBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pBufferBinds != nullptr, "NumBufferBinds is ", Attribs.NumBufferBinds, ", but pBufferBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_BUFFER) != 0, "NumBufferBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_BUFFER capability is not supported");
    }
    if (Attribs.NumTextureBinds != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pTextureBinds != nullptr, "NumTextureBinds is ", Attribs.NumTextureBinds, ", but pTextureBinds is null");
        CHECK_BIND_SPARSE_ATTRIBS((SparseRes.CapFlags & SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D) != 0, "NumTextureBinds must be zero if SPARSE_RESOURCE_CAP_FLAG_TEXTURE_2D capability is not supported");
    }

    CHECK_BIND_SPARSE_ATTRIBS(Attribs.NumBufferBinds > 0 || Attribs.NumTextureBinds > 0, "One of NumBufferBinds and NumTextureBinds must not be zero");

#ifdef DILIGENT_DEVELOPMENT
    const bool IsMetal = pDevice->GetDeviceInfo().IsMetalDevice();

    for (Uint32 i = 0; i < Attribs.NumBufferBinds; ++i)
    {
        const SparseBufferMemoryBindInfo& Bind = Attribs.pBufferBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pBuffer != nullptr, "pBufferBinds[", i, "].pBuffer must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pBufferBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pBufferBinds[", i, "].pRanges must not be null");

        if (Bind.pBuffer == nullptr)
            continue;

        const BufferDesc& Desc = Bind.pBuffer->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pBufferBinds[", i, "].pBuffer must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseBufferProperties& BuffSparseProps = Bind.pBuffer->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseBufferMemoryBindRange& Range = Bind.pRanges[r];
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset + Range.MemorySize <= Desc.Size,
                                      "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.BufferOffset, " and size ",
                                      Range.MemorySize, " that exceeds the buffer size (", Desc.Size, ")");
            CHECK_BIND_SPARSE_ATTRIBS(Range.BufferOffset % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].BufferOffset (", Range.BufferOffset,
                                      ") must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % BuffSparseProps.BlockSize == 0,
                                      "pBufferBinds[", i, "].pRanges[", r, "].MemorySize must be a multiple of the buffer block size (", BuffSparseProps.BlockSize, ")");

            if (Range.pMemory != nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pBuffer),
                                          "pBufferBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pBuffer");

                const Uint64 Capacity = Range.pMemory->GetCapacity();
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize, " that exceeds the device memory size (", Capacity, ")");
                // Can not check here because final memory offset depends on the device memory object implementation
                //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                          "pBufferBinds[", i, "].pRanges[", r, "] specifies a range with offset ", Range.MemoryOffset,
                                          " and size ", Range.MemorySize,
                                          " that does not fit into a single page. in Direct3D12 and Vulkan this will be an error");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pBufferBinds[", i, "].pRanges[", r, "]: if pMemory is null, but MemoryOffset is not zero");
            }
        }
    }

    for (Uint32 i = 0; i < Attribs.NumTextureBinds; ++i)
    {
        const SparseTextureMemoryBindInfo& Bind = Attribs.pTextureBinds[i];
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pTexture != nullptr, "pTextureBinds[", i, "].pTexture must not be null");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.NumRanges != 0, "pTextureBinds[", i, "].NumRanges must not be zero");
        CHECK_BIND_SPARSE_ATTRIBS(Bind.pRanges != nullptr, "pTextureBinds[", i, "].pRanges must not be null");

        if (Bind.pTexture == nullptr)
            continue;

        const TextureDesc& Desc = Bind.pTexture->GetDesc();
        CHECK_BIND_SPARSE_ATTRIBS(Desc.Usage == USAGE_SPARSE, "pTextureBinds[", i, "].pTexture must be created with USAGE_SPARSE");

        if (Bind.pRanges == nullptr)
            continue;

        const SparseTextureProperties& TexSparseProps = Bind.pTexture->GetSparseProperties();
        for (Uint32 r = 0; r < Bind.NumRanges; ++r)
        {
            const SparseTextureMemoryBindRange& Range     = Bind.pRanges[r];
            const Box&                          Region    = Range.Region;
            const MipLevelProperties            MipProps  = GetMipLevelProperties(Desc, Range.MipLevel);
            const Uint32                        MipWidth  = MipProps.StorageWidth;
            const Uint32                        MipHeight = MipProps.StorageHeight;
            const Uint32                        MipDepth  = MipProps.Depth;

            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel < Desc.MipLevels,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must be less than the mip level count (", Desc.MipLevels, ").");
            CHECK_BIND_SPARSE_ATTRIBS(Range.MipLevel <= TexSparseProps.FirstMipInTail,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MipLevel (", Range.MipLevel,
                                      ") must not exceed the first mip in tail (", TexSparseProps.FirstMipInTail, ")");

            if (Range.MipLevel < TexSparseProps.FirstMipInTail)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail must be zero when Range.MipLevel is not a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Region.IsValid(),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be valid");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxX <= MipWidth || Region.MaxX == AlignUp(MipWidth, TexSparseProps.TileSize[0]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxX (", Region.MaxX, ") must not exceed the mip level width (", MipWidth, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxY <= MipHeight || Region.MaxY == AlignUp(MipHeight, TexSparseProps.TileSize[1]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxY (", Region.MaxY, ") must not exceed the mip level height (", MipHeight, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Region.MaxZ <= MipDepth || Region.MaxZ == AlignUp(MipDepth, TexSparseProps.TileSize[2]),
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MaxZ (", Region.MaxZ, ") must not exceed the mip level depth (", MipDepth, ")");

                CHECK_BIND_SPARSE_ATTRIBS((Region.MinX % TexSparseProps.TileSize[0]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinX (", Region.MinX, ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinY % TexSparseProps.TileSize[1]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinY (", Region.MinY, ") must be a multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.MinZ % TexSparseProps.TileSize[2]) == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region.MinZ (", Region.MinZ, ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Width() % TexSparseProps.TileSize[0]) == 0 || Region.MaxX == MipWidth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region width (", Region.Width(), ") must be a multiple of the tile width (", TexSparseProps.TileSize[0], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Height() % TexSparseProps.TileSize[1]) == 0 || Region.MaxY == MipHeight,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region height (", Region.Height(), ") must be multiple of the tile height (", TexSparseProps.TileSize[1], ")");
                CHECK_BIND_SPARSE_ATTRIBS((Region.Depth() % TexSparseProps.TileSize[2]) == 0 || Region.MaxZ == MipDepth,
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region depth (", Region.Depth(), ") must be a multiple of the tile depth (", TexSparseProps.TileSize[2], ")");
            }
            else
            {
                CHECK_BIND_SPARSE_ATTRIBS(Region == Box{},
                                          "pTextureBinds[", i, "].pRanges[", r, "].Region must be default when Range.MipLevel is a tail mip");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail + Range.MemorySize <= TexSparseProps.MipTailSize,
                                          "pTextureBinds[", i, "].pRanges[", r, "] specifies OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") and MemorySize (", Range.MemorySize, ") that exceed the mip tail size (", TexSparseProps.MipTailSize, ")");
                CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail % TexSparseProps.BlockSize == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "].OffsetInMipTail (", Range.OffsetInMipTail,
                                          ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

                if (TexSparseProps.Flags & SPARSE_TEXTURE_FLAG_SINGLE_MIPTAIL)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice == 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be 0 for a single mip tail");
                }

                if (IsMetal)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.OffsetInMipTail == 0 && (Range.MemorySize == 0 || Range.MemorySize == TexSparseProps.MipTailSize),
                                              "pTextureBinds[", i, "].pRanges[", r, "]: in Metal, mip tail must be bound in a single memory range: ",
                                              "OffsetInMipTail (", Range.OffsetInMipTail, ") must be zero and MemorySize (", Range.MemorySize,
                                              ") must be equal to the mip tail size (", TexSparseProps.MipTailSize, ") or zero");
                }
            }

            CHECK_BIND_SPARSE_ATTRIBS(Range.ArraySlice < Desc.GetArraySize(),
                                      "pTextureBinds[", i, "].pRanges[", r, "].ArraySlice (", Range.ArraySlice, ") must be less than the array size (", Desc.GetArraySize(), ")");

            // MemorySize can be zero
            CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize % TexSparseProps.BlockSize == 0,
                                      "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize,
                                      ") must be a multiple of the texture block size (", TexSparseProps.BlockSize, ")");

            // In Metal, MemorySize is not defined and not used
            if (!IsMetal)
            {
                if (Range.MemorySize != 0 && Range.MipLevel < TexSparseProps.FirstMipInTail)
                {
                    const uint3  TilesInBox = GetNumSparseTilesInBox(Region, TexSparseProps.TileSize);
                    const Uint32 NumBlocks  = TilesInBox.x * TilesInBox.y * TilesInBox.z;
                    CHECK_BIND_SPARSE_ATTRIBS(Uint64{NumBlocks} * Uint64{TexSparseProps.BlockSize} == Range.MemorySize,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize (", Range.MemorySize, ") does not match the sparse memory blocks count (",
                                              NumBlocks, ") in the specified region");
                }

                // packed mip tail
                if (Range.MipLevel == TexSparseProps.FirstMipInTail)
                {
                    // MemorySize is used to specify how much block must be bound/unbound
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemorySize != 0,
                                              "pTextureBinds[", i, "].pRanges[", r, "].MemorySize must not be zero");
                }

                if (Range.pMemory != nullptr)
                {
                    CHECK_BIND_SPARSE_ATTRIBS(Range.pMemory->IsCompatible(Bind.pTexture),
                                              "pTextureBinds[", i, "].pRanges[", r, "].pMemory must be compatible with pTexture");

                    const Uint64 Capacity = Range.pMemory->GetCapacity();
                    CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset + Range.MemorySize <= Capacity,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (",
                                              Range.MemorySize, ") that exceed the memory capacity (", Capacity, ")");
                    // Can not check here because the final memory offset depends on the device memory object implementation
                    //CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset % BuffSparseProps.BlockSize == 0)

                    const Uint64 PageSize = Range.pMemory->GetDesc().PageSize;
                    CHECK_BIND_SPARSE_ATTRIBS((Range.MemoryOffset % PageSize) + Range.MemorySize <= PageSize,
                                              "pTextureBinds[", i, "].pRanges[", r, "] specifies MemoryOffset (", Range.MemoryOffset, ") and MemorySize (", Range.MemorySize,
                                              ") that don't fit into a single page. In Direct3D12 and Vulkan this will be an error");
                }
            }

            if (Range.pMemory == nullptr)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Range.MemoryOffset == 0,
                                          "pTextureBinds[", i, "].pRanges[", r, "]: pMemory is null, but MemoryOffset is not zero");
            }
        }
    }
#endif // DILIGENT_DEVELOPMENT

    if (Attribs.NumWaitFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences != nullptr, "ppWaitFences must not be null if NumWaitFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pWaitFenceValues != nullptr, "pWaitFenceValues must not be null if NumWaitFences is not zero");

        if (Attribs.pWaitFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumWaitFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i] != nullptr, "ppWaitFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppWaitFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppWaitFences[", i, "] must be GENERAL type");
            }
        }
    }

    if (Attribs.NumSignalFences != 0)
    {
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences != nullptr, "ppSignalFences must not be null if NumSignalFences is not zero");
        CHECK_BIND_SPARSE_ATTRIBS(Attribs.pSignalFenceValues != nullptr, "pSignalFenceValues must not be null if NumSignalFences is not zero");

        if (Attribs.pSignalFenceValues != nullptr)
        {
            for (Uint32 i = 0; i < Attribs.NumSignalFences; ++i)
            {
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i] != nullptr, "ppSignalFences[", i, "] must not be null");
                CHECK_BIND_SPARSE_ATTRIBS(Attribs.ppSignalFences[i]->GetDesc().Type == FENCE_TYPE_GENERAL, "ppSignalFences[", i, "] must be GENERAL type");
            }
        }
    }

#undef CHECK_BIND_SPARSE_ATTRIBS

    return true;
}